

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

void amqpvalue_clear(AMQP_VALUE_DATA *value_data)

{
  ulong local_28;
  size_t i_2;
  size_t i_1;
  size_t i;
  AMQP_VALUE_DATA *value_data_local;
  
  switch(value_data->type) {
  case AMQP_TYPE_BINARY:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      free((value_data->value).binary_value.bytes);
    }
    break;
  case AMQP_TYPE_STRING:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      free((value_data->value).binary_value.bytes);
    }
    break;
  case AMQP_TYPE_SYMBOL:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      free((value_data->value).binary_value.bytes);
    }
    break;
  case AMQP_TYPE_LIST:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      for (i_1 = 0; i_1 < (value_data->value).binary_value.length; i_1 = i_1 + 1) {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value_data->value).described_value.descriptor)->type + i_1 * 2));
      }
      free((value_data->value).binary_value.bytes);
      (value_data->value).described_value.descriptor = (AMQP_VALUE)0x0;
    }
    break;
  case AMQP_TYPE_MAP:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      for (i_2 = 0; i_2 < (value_data->value).binary_value.length; i_2 = i_2 + 1) {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value_data->value).described_value.descriptor)->type + i_2 * 4));
        amqpvalue_destroy((&((value_data->value).described_value.descriptor)->value)[i_2].
                          described_value.descriptor);
      }
      free((value_data->value).binary_value.bytes);
      (value_data->value).described_value.descriptor = (AMQP_VALUE)0x0;
    }
    break;
  case AMQP_TYPE_ARRAY:
    if ((value_data->value).described_value.descriptor != (AMQP_VALUE)0x0) {
      for (local_28 = 0; local_28 < (value_data->value).binary_value.length; local_28 = local_28 + 1
          ) {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value_data->value).described_value.descriptor)->type + local_28 * 2))
        ;
      }
      free((value_data->value).binary_value.bytes);
      (value_data->value).described_value.descriptor = (AMQP_VALUE)0x0;
    }
    break;
  case AMQP_TYPE_DESCRIBED:
  case AMQP_TYPE_COMPOSITE:
    amqpvalue_destroy((value_data->value).described_value.descriptor);
    amqpvalue_destroy((value_data->value).described_value.value);
  }
  value_data->type = AMQP_TYPE_UNKNOWN;
  return;
}

Assistant:

static void amqpvalue_clear(AMQP_VALUE_DATA* value_data)
{
    switch (value_data->type)
    {
    default:
        break;

    case AMQP_TYPE_BINARY:
        if (value_data->value.binary_value.bytes != NULL)
        {
            free((void*)value_data->value.binary_value.bytes);
        }
        break;
    case AMQP_TYPE_STRING:
        if (value_data->value.string_value.chars != NULL)
        {
            free(value_data->value.string_value.chars);
        }
        break;
    case AMQP_TYPE_SYMBOL:
        if (value_data->value.symbol_value.chars != NULL)
        {
            free(value_data->value.symbol_value.chars);
        }
        break;
    case AMQP_TYPE_LIST:
    {
        if (value_data->value.list_value.items != NULL)
        {
            size_t i;
            for (i = 0; i < value_data->value.list_value.count; i++)
            {
                amqpvalue_destroy(value_data->value.list_value.items[i]);
            }

            free(value_data->value.list_value.items);
            value_data->value.list_value.items = NULL;
        }
        break;
    }
    case AMQP_TYPE_MAP:
    {
        if (value_data->value.map_value.pairs != NULL)
        {
            size_t i;
            for (i = 0; i < value_data->value.map_value.pair_count; i++)
            {
                amqpvalue_destroy(value_data->value.map_value.pairs[i].key);
                amqpvalue_destroy(value_data->value.map_value.pairs[i].value);
            }

            free(value_data->value.map_value.pairs);
            value_data->value.map_value.pairs = NULL;
        }
        break;
    }
    case AMQP_TYPE_ARRAY:
    {
        if (value_data->value.array_value.items != NULL)
        {
            size_t i;
            for (i = 0; i < value_data->value.array_value.count; i++)
            {
                amqpvalue_destroy(value_data->value.array_value.items[i]);
            }

            free(value_data->value.array_value.items);
            value_data->value.array_value.items = NULL;
        }
        break;
    }
    case AMQP_TYPE_COMPOSITE:
    case AMQP_TYPE_DESCRIBED:
        amqpvalue_destroy(value_data->value.described_value.descriptor);
        amqpvalue_destroy(value_data->value.described_value.value);
        break;
    }

    value_data->type = AMQP_TYPE_UNKNOWN;
}